

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

_Bool al_is_compatible_bitmap(ALLEGRO_BITMAP *bitmap)

{
  ALLEGRO_DISPLAY *pAVar1;
  ALLEGRO_BITMAP *in_RDI;
  ALLEGRO_DISPLAY *display;
  _Bool local_1;
  
  pAVar1 = al_get_current_display();
  if (pAVar1 == (ALLEGRO_DISPLAY *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = (*pAVar1->vt->is_compatible_bitmap)(pAVar1,in_RDI);
  }
  return local_1;
}

Assistant:

bool al_is_compatible_bitmap(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(bitmap);

   if (display) {
      ASSERT(display->vt);
      return display->vt->is_compatible_bitmap(display, bitmap);
   }

   return false;
}